

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

void idx2::Dealloc<short,idx2::bitstream>(hash_table<short,_idx2::bitstream> *Ht)

{
  if (Ht->Alloc != (allocator *)0x0) {
    DeallocPtr<short>(&Ht->Keys,Ht->Alloc);
    DeallocPtr<idx2::bitstream>(&Ht->Vals,Ht->Alloc);
    DeallocPtr<idx2::hash_table<short,idx2::bitstream>::bucket_status>(&Ht->Stats,Ht->Alloc);
    Ht->Size = 0;
    Ht->LogCapacity = 0;
    Ht->Alloc = (allocator *)0x0;
  }
  return;
}

Assistant:

void
Dealloc(hash_table<k, v>* Ht)
{
  if (Ht->Alloc)
  {
    DeallocPtr(&Ht->Keys, Ht->Alloc);
    DeallocPtr(&Ht->Vals, Ht->Alloc);
    DeallocPtr(&Ht->Stats, Ht->Alloc);
    Ht->Size = Ht->LogCapacity = 0;
    Ht->Alloc = nullptr;
  }
}